

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

int __thiscall deqp::egl::MakeCurrentPerfTests::init(MakeCurrentPerfTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  int extraout_EAX;
  TestCaseGroup *pTVar2;
  MakeCurrentPerfCase *pMVar3;
  char *pcVar4;
  char *pcVar5;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  Spec spec_3;
  int releaseNdx_3;
  int typeNdx_3;
  int contextCountNdx_1;
  int surfaceCountNdx_1;
  int contextCounts_1 [2];
  int surfaceCounts_1 [2];
  SurfaceType types_3 [7];
  TestCaseGroup *multi;
  string local_1c8;
  string local_1a8;
  undefined1 local_184 [8];
  Spec spec_2;
  int releaseNdx_2;
  int typeNdx_2;
  int surfaceCountNdx;
  int surfaceCounts [2];
  SurfaceType types_2 [7];
  TestCaseGroup *multiSurface;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  Spec spec_1;
  int releaseNdx_1;
  int typeNdx_1;
  int contextCountNdx;
  int contextCounts [2];
  SurfaceType types_1 [3];
  TestCaseGroup *multiContext;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  Spec spec;
  int releaseNdx;
  int typeNdx;
  SurfaceType types [3];
  TestCaseGroup *simple;
  int sampleCount;
  int iterationCount;
  MakeCurrentPerfTests *this_local;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"simple",
             "Simple eglMakeCurrent performance tests using single context and surface");
  _releaseNdx = 0x400000001;
  types[0] = SURFACETYPE_WINDOW;
  for (spec.sampleCount = 0; spec.sampleCount < 3; spec.sampleCount = spec.sampleCount + 1) {
    for (spec.iterationCount = 0; spec.iterationCount < 2;
        spec.iterationCount = spec.iterationCount + 1) {
      local_58._0_4_ = (&releaseNdx)[spec.sampleCount];
      local_58._4_4_ = 1;
      spec.surfaceTypes = SURFACETYPE_PBUFFER;
      spec.contextCount._0_1_ = spec.iterationCount == 1;
      spec.surfaceCount = 100;
      spec.release = true;
      spec._13_3_ = 0;
      pMVar3 = (MakeCurrentPerfCase *)operator_new(0x128);
      pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
      MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,(Spec *)local_58);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      MakeCurrentPerfCase::Spec::toDescription_abi_cxx11_(&local_98,(Spec *)local_58);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      MakeCurrentPerfCase::MakeCurrentPerfCase(pMVar3,pEVar1,(Spec *)local_58,pcVar4,pcVar5);
      tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pMVar3);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"multi_context",
             "eglMakeCurrent performance tests using multiple contexts and single surface");
  contextCounts[0] = 1;
  contextCounts[1] = 4;
  _typeNdx_1 = 0x640000000a;
  for (releaseNdx_1 = 0; releaseNdx_1 < 2; releaseNdx_1 = releaseNdx_1 + 1) {
    for (spec_1.sampleCount = 0; spec_1.sampleCount < 3; spec_1.sampleCount = spec_1.sampleCount + 1
        ) {
      for (spec_1.iterationCount = 0; spec_1.iterationCount < 2;
          spec_1.iterationCount = spec_1.iterationCount + 1) {
        local_e0._0_4_ = contextCounts[spec_1.sampleCount];
        local_e0._4_4_ = (&typeNdx_1)[releaseNdx_1];
        spec_1.surfaceTypes = SURFACETYPE_PBUFFER;
        spec_1.contextCount._0_1_ = spec_1.iterationCount == 1;
        spec_1.surfaceCount = 100;
        spec_1.release = true;
        spec_1._13_3_ = 0;
        pMVar3 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_100,(Spec *)local_e0);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        MakeCurrentPerfCase::Spec::toDescription_abi_cxx11_(&local_120,(Spec *)local_e0);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        MakeCurrentPerfCase::MakeCurrentPerfCase(pMVar3,pEVar1,(Spec *)local_e0,pcVar4,pcVar5);
        tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pMVar3);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"multi_surface",
             "eglMakeCurrent performance tests using single context and multiple surfaces");
  surfaceCounts[0] = 1;
  surfaceCounts[1] = 4;
  _typeNdx_2 = 0x640000000a;
  for (releaseNdx_2 = 0; releaseNdx_2 < 2; releaseNdx_2 = releaseNdx_2 + 1) {
    for (spec_2.sampleCount = 0; spec_2.sampleCount < 7; spec_2.sampleCount = spec_2.sampleCount + 1
        ) {
      for (spec_2.iterationCount = 0; spec_2.iterationCount < 2;
          spec_2.iterationCount = spec_2.iterationCount + 1) {
        local_184._0_4_ = surfaceCounts[spec_2.sampleCount];
        spec_2.surfaceTypes = (&typeNdx_2)[releaseNdx_2];
        local_184._4_4_ = 1;
        spec_2.contextCount._0_1_ = spec_2.iterationCount == 1;
        spec_2.surfaceCount = 100;
        spec_2.release = true;
        spec_2._13_3_ = 0;
        pMVar3 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_1a8,(Spec *)local_184);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        MakeCurrentPerfCase::Spec::toDescription_abi_cxx11_(&local_1c8,(Spec *)local_184);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        MakeCurrentPerfCase::MakeCurrentPerfCase(pMVar3,pEVar1,(Spec *)local_184,pcVar4,pcVar5);
        tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pMVar3);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"complex",
             "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");
  surfaceCounts_1[0] = 1;
  surfaceCounts_1[1] = 4;
  contextCounts_1[0] = 10;
  contextCounts_1[1] = 100;
  _contextCountNdx_1 = 0x640000000a;
  for (typeNdx_3 = 0; typeNdx_3 < 2; typeNdx_3 = typeNdx_3 + 1) {
    for (releaseNdx_3 = 0; releaseNdx_3 < 2; releaseNdx_3 = releaseNdx_3 + 1) {
      for (spec_3.sampleCount = 0; spec_3.sampleCount < 7;
          spec_3.sampleCount = spec_3.sampleCount + 1) {
        for (spec_3.iterationCount = 0; spec_3.iterationCount < 2;
            spec_3.iterationCount = spec_3.iterationCount + 1) {
          local_230._0_4_ = surfaceCounts_1[spec_3.sampleCount];
          local_230._4_4_ = (&contextCountNdx_1)[releaseNdx_3];
          spec_3.surfaceTypes = contextCounts_1[typeNdx_3];
          spec_3.contextCount._0_1_ = spec_3.iterationCount == 1;
          spec_3.surfaceCount = 100;
          spec_3.release = true;
          spec_3._13_3_ = 0;
          pMVar3 = (MakeCurrentPerfCase *)operator_new(0x128);
          pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
          MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_250,(Spec *)local_230);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          MakeCurrentPerfCase::Spec::toDescription_abi_cxx11_(&local_270,(Spec *)local_230);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          MakeCurrentPerfCase::MakeCurrentPerfCase(pMVar3,pEVar1,(Spec *)local_230,pcVar4,pcVar5);
          tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pMVar3);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_250);
        }
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  return extraout_EAX;
}

Assistant:

void MakeCurrentPerfTests::init (void)
{
	const int iterationCount	= 100;
	const int sampleCount		= 100;

	// Add simple test group
	{
		TestCaseGroup* simple = new TestCaseGroup(m_eglTestCtx, "simple", "Simple eglMakeCurrent performance tests using single context and surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
			{
				MakeCurrentPerfCase::Spec spec;

				spec.surfaceTypes	= types[typeNdx];
				spec.contextCount	= 1;
				spec.surfaceCount	= 1;
				spec.release		= (releaseNdx == 1);
				spec.iterationCount	= iterationCount;
				spec.sampleCount	= sampleCount;

				simple->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
			}
		}

		addChild(simple);
	}

	// Add multi context test group
	{
		TestCaseGroup* multiContext = new TestCaseGroup(m_eglTestCtx, "multi_context", "eglMakeCurrent performance tests using multiple contexts and single surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		const int contextCounts[] = {
			10, 100
		};

		for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.contextCount	= contextCounts[contextCountNdx];
					spec.surfaceCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiContext->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiContext);
	}

	// Add multi surface test group
	{
		TestCaseGroup* multiSurface = new TestCaseGroup(m_eglTestCtx, "multi_surface", "eglMakeCurrent performance tests using single context and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
					spec.contextCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiSurface->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiSurface);
	}

	// Add Complex? test group
	{
		TestCaseGroup* multi = new TestCaseGroup(m_eglTestCtx, "complex", "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};


		const int contextCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
			{
				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
				{
					for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
					{
						MakeCurrentPerfCase::Spec spec;

						spec.surfaceTypes	= types[typeNdx];
						spec.contextCount	= contextCounts[contextCountNdx];
						spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
						spec.release		= (releaseNdx == 1);
						spec.iterationCount	= iterationCount;
						spec.sampleCount	= sampleCount;

						multi->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
					}
				}
			}
		}

		addChild(multi);
	}
}